

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::Arguments::AddArguments<std::__cxx11::string>
          (Arguments *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  const_iterator i;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffffa8);
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    std::vector<char_*,_std::allocator<char_*>_>::end(in_stack_ffffffffffffffa8);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator-
              ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
               in_stack_ffffffffffffffb8._M_current,(difference_type)in_RDI);
    __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
    __normal_iterator<char**>
              ((__normal_iterator<char_*const_*,_std::vector<char_*,_std::allocator<char_*>_>_> *)
               in_RDI,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                      in_stack_ffffffffffffffa8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(local_18);
    std::__cxx11::string::c_str();
    posix::StrDup((char *)0x14f2a7);
    in_stack_ffffffffffffffb8 =
         std::vector<char_*,_std::allocator<char_*>_>::insert
                   (in_RDI,in_stack_ffffffffffffffb8._M_current,
                    (value_type *)in_stack_ffffffffffffffa8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void AddArguments(const ::std::vector<Str>& arguments) {
    for (typename ::std::vector<Str>::const_iterator i = arguments.begin();
         i != arguments.end();
         ++i) {
      args_.insert(args_.end() - 1, posix::StrDup(i->c_str()));
    }
  }